

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# record.hpp
# Opt level: O2

void __thiscall Excel::Record::~Record(Record *this)

{
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&(this->m_borders).super__Vector_base<int,_std::allocator<int>_>);
  RecordSubstream::~RecordSubstream(&this->m_stream);
  return;
}

Assistant:

inline
Record::~Record()
{
}